

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::CreateSingleCaseSwitch
          (MergeReturnPass *this,BasicBlock *merge_target)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  this_00;
  iterator iVar1;
  IRContext *context;
  uint32_t uVar2;
  uint32_t default_id;
  uint32_t merge_id;
  Instruction **ppIVar3;
  BasicBlock *this_01;
  CFG *pCVar4;
  iterator local_70;
  InstructionBuilder builder;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  local_48;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
       (((this->function_->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  ppIVar3 = (Instruction **)
            ((long)this_00._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl + 0x20);
  do {
    iVar1.node_ = *ppIVar3;
    ppIVar3 = &((iVar1.node_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while ((iVar1.node_)->opcode_ == OpVariable);
  context = (this->super_MemPass).super_Pass.context_;
  uVar2 = Pass::TakeNextId((Pass *)this);
  local_70.super_iterator.node_ = (iterator)(iterator)iVar1.node_;
  this_01 = BasicBlock::SplitBasicBlock
                      ((BasicBlock *)
                       this_00._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
                       context,uVar2,&local_70);
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_MemPass).super_Pass.context_,
             (BasicBlock *)
             this_00._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  uVar2 = InstructionBuilder::GetUintConstantId(&builder,0);
  if (uVar2 != 0) {
    default_id = BasicBlock::id(this_01);
    local_48.
    super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    merge_id = BasicBlock::id(merge_target);
    InstructionBuilder::AddSwitch(&builder,uVar2,default_id,&local_48,merge_id,0);
    std::
    vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
    ::~vector(&local_48);
    if ((((this->super_MemPass).super_Pass.context_)->valid_analyses_ & kAnalysisCFG) !=
        kAnalysisNone) {
      pCVar4 = Pass::cfg((Pass *)this);
      CFG::RegisterBlock(pCVar4,this_01);
      pCVar4 = Pass::cfg((Pass *)this);
      CFG::AddEdges(pCVar4,(BasicBlock *)
                           this_00._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
    }
  }
  return uVar2 != 0;
}

Assistant:

bool MergeReturnPass::CreateSingleCaseSwitch(BasicBlock* merge_target) {
  // Insert the switch before any code is run.  We have to split the entry
  // block to make sure the OpVariable instructions remain in the entry block.
  BasicBlock* start_block = &*function_->begin();
  auto split_pos = start_block->begin();
  while (split_pos->opcode() == spv::Op::OpVariable) {
    ++split_pos;
  }

  BasicBlock* old_block =
      start_block->SplitBasicBlock(context(), TakeNextId(), split_pos);

  // Add the switch to the end of the entry block.
  InstructionBuilder builder(
      context(), start_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t const_zero_id = builder.GetUintConstantId(0u);
  if (const_zero_id == 0) {
    return false;
  }
  builder.AddSwitch(const_zero_id, old_block->id(), {}, merge_target->id());

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(old_block);
    cfg()->AddEdges(start_block);
  }
  return true;
}